

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsk.c
# Opt level: O2

LispPTR COM_truncatefile(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  int *piVar4;
  LispPTR __fd;
  LispPTR LVar5;
  stat sbuf;
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 != 0) {
    iVar2 = 100;
    goto LAB_0011b9fa;
  }
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);
  uVar1 = *args;
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    __fd = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    __fd = uVar1 & 0xffff;
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(uVar1);
    __fd = *pLVar3;
  }
  uVar1 = args[1];
  if ((uVar1 & 0xfff0000) == 0xf0000) {
    LVar5 = uVar1 | 0xffff0000;
  }
  else if ((uVar1 & 0xfff0000) == 0xe0000) {
    LVar5 = uVar1 & 0xffff;
  }
  else {
    pLVar3 = NativeAligned4FromLAddr(uVar1);
    LVar5 = *pLVar3;
  }
  alarm(TIMEOUT_TIME);
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    iVar2 = fstat(__fd,(stat *)&sbuf);
    if (iVar2 != -1) {
      alarm(0);
      if ((sbuf.st_mode & 0xf000) != 0x8000) {
        return 0x4c;
      }
      if (sbuf.st_size == (int)LVar5) {
        return 0x4c;
      }
      alarm(TIMEOUT_TIME);
      goto LAB_0011ba4d;
    }
  } while (*piVar4 == 4);
  alarm(0);
  goto LAB_0011b9f7;
  while (*piVar4 == 4) {
LAB_0011ba4d:
    *piVar4 = 0;
    iVar2 = ftruncate(__fd,(long)(int)LVar5);
    if (iVar2 != -1) break;
  }
  alarm(0);
  if (iVar2 == 0) {
    alarm(TIMEOUT_TIME);
    do {
      *piVar4 = 0;
      iVar2 = fsync(__fd);
      if (iVar2 != -1) break;
    } while (*piVar4 == 4);
    alarm(0);
    if (iVar2 == 0) {
      return 0x4c;
    }
  }
LAB_0011b9f7:
  iVar2 = *piVar4;
LAB_0011b9fa:
  *Lisp_errno = iVar2;
  return 0;
}

Assistant:

LispPTR COM_truncatefile(LispPTR *args)
{
  int fd;
  int length;
  int rval;
  struct stat sbuf;

  ERRSETJMP(NIL);
  Lisp_errno = (int *)NativeAligned4FromLAddr(args[2]);

  fd = LispNumToCInt(args[0]);
  length = LispNumToCInt(args[1]);

  TIMEOUT(rval = fstat(fd, &sbuf));
  if (rval == -1) {
    *Lisp_errno = errno;
    return (NIL);
  }

  if (!S_ISREG(sbuf.st_mode)) {
    /*
     * The request file is not a regular file.  We don't need to
     * truncate such file.
     */
    return (ATOM_T);
  }
  if ((off_t)length != sbuf.st_size) {
#ifdef DOS
    TIMEOUT(rval = chsize(fd, (off_t)length));
#else
    TIMEOUT(rval = ftruncate(fd, (off_t)length));
#endif /* DOS */
    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }

/*
 * TRUNCATEFILE FDEV method is invoked from FORCEOUTPUT Lisp function.
 * Thus we have to sync the file state here.
 */
#ifndef DOS
    TIMEOUT(rval = fsync(fd));
#endif

    if (rval != 0) {
      *Lisp_errno = errno;
      return (NIL);
    }
  }
  return (ATOM_T);
}